

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O0

Aig_Man_t * Ssw_SignalCorrespondence(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Ssw_Man_t *p_00;
  Ssw_Cla_t *pSVar4;
  Ssw_Sml_t *pSVar5;
  int *piVar6;
  Ssw_Man_t *p;
  Aig_Man_t *pAigNew;
  Ssw_Pars_t Pars;
  Ssw_Pars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  Pars.pFunc = pPars;
  iVar1 = Aig_ManRegNum(pAig);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCore.c"
                  ,0x1a4,"Aig_Man_t *Ssw_SignalCorrespondence(Aig_Man_t *, Ssw_Pars_t *)");
  }
  Aig_ManRandom(1);
  if (Pars.pFunc == (void *)0x0) {
    Pars.pFunc = &pAigNew;
    Ssw_ManSetDefaultParams((Ssw_Pars_t *)&pAigNew);
  }
  iVar1 = Aig_ManNodeNum(pAig);
  if (iVar1 == 0) {
    *(undefined4 *)((long)Pars.pFunc + 0x90) = 0;
    iVar1 = Aig_ManObjNumMax(pAig);
    Aig_ManReprStart(pAig,iVar1);
    pAig_local = Aig_ManDupOrdered(pAig);
  }
  else {
    if (*(int *)((long)Pars.pFunc + 0x7c) == 0) {
      if (*(int *)((long)Pars.pFunc + 8) < 1) {
        __assert_fail("pPars->nFramesK > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCore.c"
                      ,0x1bc,"Aig_Man_t *Ssw_SignalCorrespondence(Aig_Man_t *, Ssw_Pars_t *)");
      }
      if (((0 < *Pars.pFunc) && (iVar1 = *Pars.pFunc, iVar2 = Aig_ManRegNum(pAig), iVar1 < iVar2))
         || ((pAig->vClockDoms != (Vec_Vec_t *)0x0 &&
             (iVar1 = Vec_VecSize(pAig->vClockDoms), 0 < iVar1)))) {
        pAVar3 = Ssw_SignalCorrespondencePart(pAig,(Ssw_Pars_t *)Pars.pFunc);
        return pAVar3;
      }
    }
    else {
      *(undefined4 *)((long)Pars.pFunc + 0x40) = 1;
      *(undefined4 *)((long)Pars.pFunc + 0xc) = 0;
      if ((pAig->vClockDoms != (Vec_Vec_t *)0x0) &&
         (iVar1 = Vec_VecSize(pAig->vClockDoms), 0 < iVar1)) {
        pAVar3 = Ssw_SignalCorrespondencePart(pAig,(Ssw_Pars_t *)Pars.pFunc);
        return pAVar3;
      }
    }
    if (*(int *)((long)Pars.pFunc + 0x60) == 0) {
      p_00 = Ssw_ManCreate(pAig,(Ssw_Pars_t *)Pars.pFunc);
      if (p_00->pPars->fConstrs == 0) {
        pSVar4 = Ssw_ClassesPrepare(pAig,*(int *)((long)Pars.pFunc + 8),
                                    *(int *)((long)Pars.pFunc + 0x40),
                                    *(int *)((long)Pars.pFunc + 0x44),
                                    *(int *)((long)Pars.pFunc + 0x48),
                                    *(int *)((long)Pars.pFunc + 0x18),
                                    *(int *)((long)Pars.pFunc + 0x68));
        p_00->ppClasses = pSVar4;
        if (*(int *)((long)Pars.pFunc + 0x7c) == 0) {
          if (*(int *)((long)Pars.pFunc + 0x50) == 0) {
            pSVar5 = Ssw_SmlStart(pAig,0,p_00->pPars->nFramesAddSim + 1,1);
            p_00->pSml = pSVar5;
          }
          else {
            pSVar5 = Ssw_SmlStart(pAig,0,p_00->nFrames + p_00->pPars->nFramesAddSim,1);
            p_00->pSml = pSVar5;
          }
        }
        else {
          pSVar5 = Ssw_SmlStart(pAig,0,2,1);
          p_00->pSml = pSVar5;
        }
        Ssw_ClassesSetData(p_00->ppClasses,p_00->pSml,Ssw_SmlObjHashWord,Ssw_SmlObjIsConstWord,
                           Ssw_SmlObjsAreEqualWord);
      }
      else {
        pSVar4 = Ssw_ClassesPrepareSimple
                           (pAig,*(int *)((long)Pars.pFunc + 0x40),*(int *)((long)Pars.pFunc + 0x18)
                           );
        p_00->ppClasses = pSVar4;
        Ssw_ClassesSetData(p_00->ppClasses,(void *)0x0,(_func_uint_void_ptr_Aig_Obj_t_ptr *)0x0,
                           Ssw_SmlObjIsConstBit,Ssw_SmlObjsAreEqualBit);
        iVar1 = Ssw_ManSetConstrPhases(pAig,p_00->pPars->nFramesK + 1,&p_00->vInits);
        if (iVar1 != 0) {
          Abc_Print(1,
                    "Ssw_SignalCorrespondence(): The init state does not satisfy the constraints!\n"
                   );
          p_00->pPars->fVerbose = 0;
          Ssw_ManStop(p_00);
          return (Aig_Man_t *)0x0;
        }
        Ssw_ManRefineByConstrSim(p_00);
      }
      if ((p_00->pPars->fLocalSim != 0) && (p_00->pSml != (Ssw_Sml_t *)0x0)) {
        iVar1 = Ssw_SmlNumFrames(p_00->pSml);
        iVar2 = Aig_ManObjNumMax(p_00->pAig);
        piVar6 = (int *)calloc((long)(iVar1 * iVar2),4);
        p_00->pVisited = piVar6;
      }
      pAig_local = Ssw_SignalCorrespondenceRefine(p_00);
      if ((*(int *)((long)Pars.pFunc + 0x10) != 0) && (*(int *)((long)Pars.pFunc + 0x68) != 0)) {
        Ssw_ReportConeReductions(p_00,pAig,pAig_local);
      }
      Ssw_ManStop(p_00);
    }
    else if (*(int *)((long)Pars.pFunc + 0x7c) == 0) {
      pAig_local = Cec_SignalCorrespondence
                             (pAig,*(int *)((long)Pars.pFunc + 0x1c),
                              *(int *)((long)Pars.pFunc + 100));
    }
    else {
      pAig_local = Cec_LatchCorrespondence
                             (pAig,*(int *)((long)Pars.pFunc + 0x1c),
                              *(int *)((long)Pars.pFunc + 100));
    }
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondence( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Ssw_Pars_t Pars;
    Aig_Man_t * pAigNew;
    Ssw_Man_t * p;
    assert( Aig_ManRegNum(pAig) > 0 );
    // reset random numbers
    Aig_ManRandom( 1 );
    // if parameters are not given, create them
    if ( pPars == NULL )
        Ssw_ManSetDefaultParams( pPars = &Pars );
    // consider the case of empty AIG
    if ( Aig_ManNodeNum(pAig) == 0 )
    {
        pPars->nIters = 0;
        // Ntl_ManFinalize() needs the following to satisfy an assertion
        Aig_ManReprStart( pAig,Aig_ManObjNumMax(pAig) );
        return Aig_ManDupOrdered(pAig);
    }
    // check and update parameters
    if ( pPars->fLatchCorrOpt )
    {
        pPars->fLatchCorr = 1;
        pPars->nFramesAddSim = 0;
        if ( (pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0) )
           return Ssw_SignalCorrespondencePart( pAig, pPars );
    }
    else
    {
        assert( pPars->nFramesK > 0 );
        // perform partitioning
        if ( (pPars->nPartSize > 0 && pPars->nPartSize < Aig_ManRegNum(pAig))
             || (pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0)  )
            return Ssw_SignalCorrespondencePart( pAig, pPars );
    }

    if ( pPars->fScorrGia )
    {
        if ( pPars->fLatchCorrOpt )
        {
            extern Aig_Man_t * Cec_LatchCorrespondence( Aig_Man_t * pAig, int nConfs, int fUseCSat );
            return Cec_LatchCorrespondence( pAig, pPars->nBTLimit, pPars->fUseCSat );
        }
        else
        {
            extern Aig_Man_t * Cec_SignalCorrespondence( Aig_Man_t * pAig, int nConfs, int fUseCSat );
            return Cec_SignalCorrespondence( pAig, pPars->nBTLimit, pPars->fUseCSat );
        }
    }

    // start the induction manager
    p = Ssw_ManCreate( pAig, pPars );
    // compute candidate equivalence classes
//    p->pPars->nConstrs = 1;
    if ( p->pPars->fConstrs )
    {
        // create trivial equivalence classes with all nodes being candidates for constant 1
        p->ppClasses = Ssw_ClassesPrepareSimple( pAig, pPars->fLatchCorr, pPars->nMaxLevs );
        Ssw_ClassesSetData( p->ppClasses, NULL, NULL, Ssw_SmlObjIsConstBit, Ssw_SmlObjsAreEqualBit );
        // derive phase bits to satisfy the constraints
        if ( Ssw_ManSetConstrPhases( pAig, p->pPars->nFramesK + 1, &p->vInits ) != 0 )
        {
            Abc_Print( 1, "Ssw_SignalCorrespondence(): The init state does not satisfy the constraints!\n" );
            p->pPars->fVerbose = 0;
            Ssw_ManStop( p );
            return NULL;
        }
        // perform simulation of the first timeframes
        Ssw_ManRefineByConstrSim( p );
    }
    else
    {
        // perform one round of seq simulation and generate candidate equivalence classes
        p->ppClasses = Ssw_ClassesPrepare( pAig, pPars->nFramesK, pPars->fLatchCorr, pPars->fConstCorr, pPars->fOutputCorr, pPars->nMaxLevs, pPars->fVerbose );
//        p->ppClasses = Ssw_ClassesPrepareTargets( pAig );
        if ( pPars->fLatchCorrOpt )
            p->pSml = Ssw_SmlStart( pAig, 0, 2, 1 );
        else if ( pPars->fDynamic )
            p->pSml = Ssw_SmlStart( pAig, 0, p->nFrames + p->pPars->nFramesAddSim, 1 );
        else
            p->pSml = Ssw_SmlStart( pAig, 0, 1 + p->pPars->nFramesAddSim, 1 );
        Ssw_ClassesSetData( p->ppClasses, p->pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );
    }
    // allocate storage
    if ( p->pPars->fLocalSim && p->pSml )
        p->pVisited = ABC_CALLOC( int, Ssw_SmlNumFrames( p->pSml ) * Aig_ManObjNumMax(p->pAig) );
    // perform refinement of classes
    pAigNew = Ssw_SignalCorrespondenceRefine( p );
//    Ssw_ReportOutputs( pAigNew );
    if ( pPars->fConstrs && pPars->fVerbose )
        Ssw_ReportConeReductions( p, pAig, pAigNew );
    // cleanup
    Ssw_ManStop( p );
    return pAigNew;
}